

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O2

optional<cmGlobalGenerator::FrameworkDescriptor> * __thiscall
cmGlobalGenerator::SplitFrameworkPath
          (optional<cmGlobalGenerator::FrameworkDescriptor> *__return_storage_ptr__,
          cmGlobalGenerator *this,string *path,FrameworkFormat format)

{
  bool bVar1;
  int iVar2;
  string *this_00;
  string_view prefix;
  string_view str;
  string name;
  string libname;
  string ext;
  FrameworkDescriptor local_1c0;
  string local_140;
  string local_120;
  string local_100;
  string local_e0;
  string local_c0;
  string local_a0;
  string local_80;
  string local_60;
  string local_40;
  
  if (SplitFrameworkPath(std::__cxx11::string_const&,cmGlobalGenerator::FrameworkFormat)::
      frameworkPath == '\0') {
    iVar2 = __cxa_guard_acquire(&SplitFrameworkPath(std::__cxx11::string_const&,cmGlobalGenerator::FrameworkFormat)
                                 ::frameworkPath);
    if (iVar2 != 0) {
      cmsys::RegularExpression::RegularExpression
                (&SplitFrameworkPath::frameworkPath,
                 "((.+)/)?([^/]+)\\.framework(/Versions/([^/]+))?(/(.+))?$");
      __cxa_atexit(cmsys::RegularExpression::~RegularExpression,&SplitFrameworkPath::frameworkPath,
                   &__dso_handle);
      __cxa_guard_release(&SplitFrameworkPath(std::__cxx11::string_const&,cmGlobalGenerator::FrameworkFormat)
                           ::frameworkPath);
    }
  }
  cmsys::SystemTools::GetFilenameLastExtension(&ext,path);
  if (ext._M_string_length == 0) {
LAB_002bf178:
    bVar1 = cmsys::RegularExpression::find(&SplitFrameworkPath::frameworkPath,path);
    if (!bVar1) goto LAB_002bf2f9;
    cmsys::RegularExpressionMatch::match_abi_cxx11_
              (&name,&SplitFrameworkPath::frameworkPath.regmatch,3);
    cmsys::RegularExpressionMatch::match_abi_cxx11_
              (&local_1c0.Directory,&SplitFrameworkPath::frameworkPath.regmatch,7);
    cmsys::SystemTools::GetFilenameWithoutExtension(&libname,&local_1c0.Directory);
    std::__cxx11::string::~string((string *)&local_1c0);
    if (libname._M_string_length != 0 || format != Strict) {
      if (libname._M_string_length == 0) {
LAB_002bf3db:
        cmsys::RegularExpressionMatch::match_abi_cxx11_
                  (&local_40,&SplitFrameworkPath::frameworkPath.regmatch,2);
        cmsys::RegularExpressionMatch::match_abi_cxx11_
                  (&local_60,&SplitFrameworkPath::frameworkPath.regmatch,5);
        std::__cxx11::string::string((string *)&local_80,(string *)&name);
        FrameworkDescriptor::FrameworkDescriptor(&local_1c0,&local_40,&local_60,&local_80);
        std::_Optional_payload_base<cmGlobalGenerator::FrameworkDescriptor>::
        _Optional_payload_base<cmGlobalGenerator::FrameworkDescriptor>
                  ((_Optional_payload_base<cmGlobalGenerator::FrameworkDescriptor> *)
                   __return_storage_ptr__,&local_1c0);
        FrameworkDescriptor::~FrameworkDescriptor(&local_1c0);
        std::__cxx11::string::~string((string *)&local_80);
        std::__cxx11::string::~string((string *)&local_60);
        this_00 = &local_40;
      }
      else {
        prefix._M_str = name._M_dataplus._M_p;
        prefix._M_len = name._M_string_length;
        str._M_str = libname._M_dataplus._M_p;
        str._M_len = libname._M_string_length;
        bVar1 = cmHasPrefix(str,prefix);
        if (!bVar1) goto LAB_002bf348;
        if ((libname._M_string_length == 0) || (name._M_string_length == libname._M_string_length))
        goto LAB_002bf3db;
        cmsys::RegularExpressionMatch::match_abi_cxx11_
                  (&local_a0,&SplitFrameworkPath::frameworkPath.regmatch,2);
        cmsys::RegularExpressionMatch::match_abi_cxx11_
                  (&local_c0,&SplitFrameworkPath::frameworkPath.regmatch,5);
        std::__cxx11::string::string((string *)&local_e0,(string *)&name);
        std::__cxx11::string::substr((ulong)&local_100,(ulong)&libname);
        FrameworkDescriptor::FrameworkDescriptor
                  (&local_1c0,&local_a0,&local_c0,&local_e0,&local_100);
        std::_Optional_payload_base<cmGlobalGenerator::FrameworkDescriptor>::
        _Optional_payload_base<cmGlobalGenerator::FrameworkDescriptor>
                  ((_Optional_payload_base<cmGlobalGenerator::FrameworkDescriptor> *)
                   __return_storage_ptr__,&local_1c0);
        FrameworkDescriptor::~FrameworkDescriptor(&local_1c0);
        std::__cxx11::string::~string((string *)&local_100);
        std::__cxx11::string::~string((string *)&local_e0);
        std::__cxx11::string::~string((string *)&local_c0);
        this_00 = &local_a0;
      }
      goto LAB_002bf477;
    }
LAB_002bf348:
    (__return_storage_ptr__->
    super__Optional_base<cmGlobalGenerator::FrameworkDescriptor,_false,_false>)._M_payload.
    super__Optional_payload<cmGlobalGenerator::FrameworkDescriptor,_true,_false,_false>.
    super__Optional_payload_base<cmGlobalGenerator::FrameworkDescriptor>._M_engaged = false;
  }
  else {
    bVar1 = std::operator==(&ext,".tbd");
    if (bVar1) goto LAB_002bf178;
    bVar1 = std::operator==(&ext,".framework");
    if (bVar1) goto LAB_002bf178;
LAB_002bf2f9:
    if (format != Extended) {
      (__return_storage_ptr__->
      super__Optional_base<cmGlobalGenerator::FrameworkDescriptor,_false,_false>)._M_payload.
      super__Optional_payload<cmGlobalGenerator::FrameworkDescriptor,_true,_false,_false>.
      super__Optional_payload_base<cmGlobalGenerator::FrameworkDescriptor>._M_engaged = false;
      goto LAB_002bf490;
    }
    cmsys::SystemTools::GetParentDirectory(&name,path);
    cmsys::SystemTools::GetFilenameLastExtension(&local_1c0.Directory,path);
    bVar1 = std::operator==(&local_1c0.Directory,".framework");
    if (bVar1) {
      cmsys::SystemTools::GetFilenameWithoutExtension(&libname,path);
    }
    else {
      cmsys::SystemTools::GetFilenameName(&libname,path);
    }
    std::__cxx11::string::~string((string *)&local_1c0);
    std::__cxx11::string::string((string *)&local_120,(string *)&name);
    std::__cxx11::string::string((string *)&local_140,(string *)&libname);
    FrameworkDescriptor::FrameworkDescriptor(&local_1c0,&local_120,&local_140);
    std::_Optional_payload_base<cmGlobalGenerator::FrameworkDescriptor>::
    _Optional_payload_base<cmGlobalGenerator::FrameworkDescriptor>
              ((_Optional_payload_base<cmGlobalGenerator::FrameworkDescriptor> *)
               __return_storage_ptr__,&local_1c0);
    FrameworkDescriptor::~FrameworkDescriptor(&local_1c0);
    std::__cxx11::string::~string((string *)&local_140);
    this_00 = &local_120;
LAB_002bf477:
    std::__cxx11::string::~string((string *)this_00);
  }
  std::__cxx11::string::~string((string *)&libname);
  std::__cxx11::string::~string((string *)&name);
LAB_002bf490:
  std::__cxx11::string::~string((string *)&ext);
  return __return_storage_ptr__;
}

Assistant:

cm::optional<cmGlobalGenerator::FrameworkDescriptor>
cmGlobalGenerator::SplitFrameworkPath(const std::string& path,
                                      FrameworkFormat format) const
{
  // Check for framework structure:
  //    (/path/to/)?FwName.framework
  // or (/path/to/)?FwName.framework/FwName(.tbd)?
  // or (/path/to/)?FwName.framework/Versions/*/FwName(.tbd)?
  static cmsys::RegularExpression frameworkPath(
    "((.+)/)?([^/]+)\\.framework(/Versions/([^/]+))?(/(.+))?$");

  auto ext = cmSystemTools::GetFilenameLastExtension(path);
  if ((ext.empty() || ext == ".tbd" || ext == ".framework") &&
      frameworkPath.find(path)) {
    auto name = frameworkPath.match(3);
    auto libname =
      cmSystemTools::GetFilenameWithoutExtension(frameworkPath.match(7));
    if (format == FrameworkFormat::Strict && libname.empty()) {
      return cm::nullopt;
    }
    if (!libname.empty() && !cmHasPrefix(libname, name)) {
      return cm::nullopt;
    }

    if (libname.empty() || name.size() == libname.size()) {
      return FrameworkDescriptor{ frameworkPath.match(2),
                                  frameworkPath.match(5), name };
    }

    return FrameworkDescriptor{ frameworkPath.match(2), frameworkPath.match(5),
                                name, libname.substr(name.size()) };
  }

  if (format == FrameworkFormat::Extended) {
    // path format can be more flexible: (/path/to/)?fwName(.framework)?
    auto fwDir = cmSystemTools::GetParentDirectory(path);
    auto name = cmSystemTools::GetFilenameLastExtension(path) == ".framework"
      ? cmSystemTools::GetFilenameWithoutExtension(path)
      : cmSystemTools::GetFilenameName(path);

    return FrameworkDescriptor{ fwDir, name };
  }

  return cm::nullopt;
}